

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

bool deqp::gles3::Functional::reverifyConstantDerivateWithFlushRelaxations
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Precision precision,Vec4 *derivScale,Vec4 *derivBias,
               Vec4 *surfaceThreshold,DerivateFunc derivateFunc,Linear2DFunctionEvaluator *function)

{
  undefined1 auVar1 [16];
  int i;
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  int numAccurateBits;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  float v_2;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar21;
  undefined1 auVar20 [16];
  float v;
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  Vec4 functionValueBackward;
  Vec4 functionValueForward;
  Interval forwardComponent;
  Interval backwardComponent;
  Interval numerator;
  Vec4 resultDerivative;
  Interval numeratorRange;
  Interval divisionRange;
  IVec4 green;
  IVec4 red;
  byte local_351;
  ulong local_350;
  undefined1 local_348 [16];
  ConstPixelBufferAccess *local_338;
  float local_330;
  DataType local_32c;
  undefined1 local_328 [16];
  TestLog *local_310;
  float local_304;
  float local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  float local_2f0;
  float local_2ec;
  double local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  PixelBufferAccess *local_2c0;
  undefined1 local_2b8 [16];
  float local_2a8 [6];
  undefined1 local_290 [16];
  double local_280;
  double local_278;
  void *pvStack_270;
  Vec4 *local_268;
  ulong local_260;
  Interval local_258;
  undefined1 local_240 [24];
  double local_228;
  void *local_220;
  float local_218 [4];
  Interval local_208;
  Interval local_1f0;
  IVec4 local_1d8;
  IVec4 local_1c8;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  double local_1a8;
  ios_base local_140 [272];
  
  local_1c8.m_data[0] = 0xff;
  local_1c8.m_data[1] = 0;
  local_1c8.m_data[2] = 0;
  local_1c8.m_data[3] = 0xff;
  local_1d8.m_data[0] = 0;
  local_1d8.m_data[1] = 0xff;
  local_1d8.m_data[2] = 0;
  local_1d8.m_data[3] = 0xff;
  local_338 = result;
  local_310 = log;
  local_2c0 = errorMask;
  local_32c = glu::getDataTypeFloatScalars(dataType);
  iVar12 = 0;
  numAccurateBits = 0;
  if (precision < PRECISION_LAST) {
    numAccurateBits = *(int *)(&DAT_01c5df48 + (ulong)precision * 4);
    iVar12 = *(int *)(&DAT_01c5df54 + (ulong)precision * 4);
  }
  tcu::clear(local_2c0,&local_1d8);
  if ((local_338->m_size).m_data[1] < 1) {
    iVar6 = 0;
  }
  else {
    local_2fc = numAccurateBits + -3;
    local_260 = (ulong)local_32c;
    local_350 = 0;
    iVar6 = 0;
    local_2f8 = iVar12;
    local_268 = derivScale;
    iVar10 = local_2fc;
    do {
      if (0 < (local_338->m_size).m_data[0]) {
        local_300 = (float)(int)local_350;
        local_304 = local_300 + 2.0;
        local_330 = local_300 + 0.5;
        local_300 = local_300 + -1.0;
        iVar7 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_290,(int)local_338,iVar7,(int)local_350);
          local_1b8 = (undefined1  [8])0x0;
          pp_Stack_1b0 = (_func_int **)0x0;
          lVar4 = 0;
          do {
            *(float *)(local_1b8 + lVar4 * 4) =
                 *(float *)(local_290 + lVar4 * 4) - derivBias->m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_218[0] = 0.0;
          local_218[1] = 0.0;
          local_218[2] = 0.0;
          local_218[3] = 0.0;
          lVar4 = 0;
          do {
            local_218[lVar4] = *(float *)(local_1b8 + lVar4 * 4) / derivScale->m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          fVar16 = (float)iVar7;
          if (derivateFunc == DERIVATE_DFDX) {
            local_1b8._4_4_ = local_330;
            local_1b8._0_4_ = fVar16 + 2.0;
            local_2a8[0] = 0.0;
            local_2a8[1] = 0.0;
            local_2a8[2] = 0.0;
            local_2a8[3] = 0.0;
            lVar4 = 0;
            pfVar5 = (float *)function;
            do {
              fVar22 = 0.0;
              lVar9 = 0;
              do {
                fVar22 = fVar22 + pfVar5[lVar9] * *(float *)(local_1b8 + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              local_2a8[lVar4] = fVar22;
              lVar4 = lVar4 + 1;
              pfVar5 = pfVar5 + 1;
            } while (lVar4 != 4);
          }
          else {
            local_1b8._4_4_ = local_304;
            local_1b8._0_4_ = fVar16 + 0.5;
            local_2a8[0] = 0.0;
            local_2a8[1] = 0.0;
            local_2a8[2] = 0.0;
            local_2a8[3] = 0.0;
            lVar4 = 0;
            pfVar5 = (float *)function;
            do {
              fVar22 = 0.0;
              lVar9 = 0;
              do {
                fVar22 = fVar22 + pfVar5[lVar9] * *(float *)(local_1b8 + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              local_2a8[lVar4] = fVar22;
              lVar4 = lVar4 + 1;
              pfVar5 = pfVar5 + 1;
            } while (lVar4 != 4);
          }
          if (derivateFunc == DERIVATE_DFDX) {
            local_1b8._4_4_ = local_330;
            local_1b8._0_4_ = fVar16 + -1.0;
            local_2b8 = ZEXT416(0);
            lVar4 = 0;
            pfVar5 = (float *)function;
            do {
              auVar18 = ZEXT816(0);
              lVar9 = 0;
              do {
                auVar18._0_4_ = auVar18._0_4_ + pfVar5[lVar9] * *(float *)(local_1b8 + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              *(float *)(local_2b8 + lVar4 * 4) = auVar18._0_4_;
              lVar4 = lVar4 + 1;
              pfVar5 = pfVar5 + 1;
            } while (lVar4 != 4);
          }
          else {
            local_1b8._4_4_ = local_300;
            local_1b8._0_4_ = fVar16 + 0.5;
            local_2b8 = ZEXT416(0);
            lVar4 = 0;
            pfVar5 = (float *)function;
            do {
              auVar17 = ZEXT816(0);
              lVar9 = 0;
              do {
                auVar17._0_4_ = auVar17._0_4_ + pfVar5[lVar9] * *(float *)(local_1b8 + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              *(float *)(local_2b8 + lVar4 * 4) = auVar17._0_4_;
              lVar4 = lVar4 + 1;
              pfVar5 = pfVar5 + 1;
            } while (lVar4 != 4);
          }
          pp_Stack_1b0 = (_func_int **)CONCAT44(pp_Stack_1b0._4_4_,0x3f800000);
          if ((int)local_32c < 1) {
            uVar15 = 0;
          }
          else {
            uVar13 = 0;
            uVar15 = 0;
            local_2f4 = iVar7;
            do {
              local_2d8._0_8_ = uVar15;
              local_2e8 = (double)CONCAT44(local_2e8._4_4_,local_2a8[uVar13]);
              fVar16 = addErrorUlp(local_2a8[uVar13],-0.5,iVar10);
              fVar16 = convertFloatFlushToZeroRtn(fVar16,iVar12,numAccurateBits);
              local_328._0_4_ = fVar16;
              local_348._0_8_ = INFINITY;
              if (!NAN(fVar16)) {
                local_348._0_8_ = (double)fVar16;
              }
              local_348._8_8_ = 0;
              local_278 = -INFINITY;
              if (!NAN(fVar16)) {
                local_278 = (double)fVar16;
              }
              pvStack_270 = (void *)0x0;
              fVar16 = addErrorUlp(local_2e8._0_4_,0.5,iVar10);
              fVar16 = convertFloatFlushToZeroRtn(-fVar16,iVar12,numAccurateBits);
              dVar24 = -INFINITY;
              dVar25 = INFINITY;
              if (!NAN(fVar16)) {
                dVar24 = (double)-fVar16;
                dVar25 = dVar24;
              }
              local_290[0] = NAN((float)local_328._0_4_) || NAN(fVar16);
              uVar15 = -(ulong)(local_348._0_8_ <= dVar25);
              auVar19._0_8_ = ~uVar15 & (ulong)dVar25;
              auVar19._8_8_ = 0;
              auVar1._8_4_ = local_348._8_4_;
              auVar1._0_8_ = (ulong)local_348._0_8_ & uVar15;
              auVar1._12_4_ = local_348._12_4_;
              local_348 = auVar19 | auVar1;
              local_290._8_8_ = local_348._0_8_;
              local_280 = (double)(~-(ulong)(dVar24 <= local_278) & (ulong)dVar24 |
                                  (ulong)local_278 & -(ulong)(dVar24 <= local_278));
              local_2f0 = *(float *)(local_2b8 + uVar13 * 4);
              fVar16 = addErrorUlp(local_2f0,-0.5,iVar10);
              local_2ec = convertFloatFlushToZeroRtn(fVar16,iVar12,numAccurateBits);
              local_328._0_8_ = -INFINITY;
              local_2e8 = INFINITY;
              if (!NAN(local_2ec)) {
                local_328._0_8_ = (undefined8)local_2ec;
                local_2e8 = (double)local_328._0_8_;
              }
              uStack_2e0 = 0;
              local_328._8_8_ = 0;
              local_278 = (double)CONCAT44(local_278._4_4_,iVar6);
              fVar16 = addErrorUlp(local_2f0,0.5,iVar10);
              fVar16 = convertFloatFlushToZeroRtn(-fVar16,iVar12,numAccurateBits);
              dVar24 = INFINITY;
              dVar25 = -INFINITY;
              if (!NAN(fVar16)) {
                dVar24 = (double)-fVar16;
                dVar25 = dVar24;
              }
              local_258.m_hasNaN = NAN(local_2ec) || NAN(fVar16);
              local_258.m_lo =
                   (double)(~-(ulong)(local_2e8 <= dVar24) & (ulong)dVar24 |
                           (ulong)local_2e8 & -(ulong)(local_2e8 <= dVar24));
              local_258.m_hi =
                   (double)(~-(ulong)(dVar25 <= (double)local_328._0_8_) & (ulong)dVar25 |
                           local_328._0_8_ & -(ulong)(dVar25 <= (double)local_328._0_8_));
              local_1b8 = (undefined1  [8])local_348._0_8_;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar6 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar12 = iVar6;
              if ((FVar2.m_value & 0x7fffff) != 0) {
                iVar12 = -0x7e;
              }
              if ((FVar2.m_value & 0x7f800000) != 0) {
                iVar12 = iVar6;
              }
              local_1b8 = (undefined1  [8])local_280;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar6 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar10 = iVar6;
              if ((FVar2.m_value & 0x7fffff) != 0) {
                iVar10 = -0x7e;
              }
              if ((FVar2.m_value & 0x7f800000) != 0) {
                iVar10 = iVar6;
              }
              if (iVar10 < iVar12) {
                iVar10 = iVar12;
              }
              local_1b8 = (undefined1  [8])local_258.m_lo;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar12 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar6 = -0x7e;
              if ((FVar2.m_value & 0x7fffff) == 0) {
                iVar6 = iVar12;
              }
              if ((FVar2.m_value & 0x7f800000) == 0) {
                iVar12 = iVar6;
              }
              local_1b8 = (undefined1  [8])local_258.m_hi;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar7 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar6 = -0x7e;
              if ((FVar2.m_value & 0x7fffff) == 0) {
                iVar6 = iVar7;
              }
              if ((FVar2.m_value & 0x7f800000) == 0) {
                iVar7 = iVar6;
              }
              if (iVar7 < iVar12) {
                iVar7 = iVar12;
              }
              if (iVar10 <= iVar7) {
                iVar10 = iVar7;
              }
              tcu::operator-((Interval *)(local_240 + 0x10),(Interval *)local_290,&local_258);
              local_1b8 = (undefined1  [8])local_228;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar6 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar12 = -0x7e;
              if ((FVar2.m_value & 0x7fffff) == 0) {
                iVar12 = iVar6;
              }
              if ((FVar2.m_value & 0x7f800000) == 0) {
                iVar6 = iVar12;
              }
              local_1b8 = (undefined1  [8])local_220;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar7 = local_2f4;
              iVar12 = local_2f8;
              iVar8 = (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              iVar14 = -0x7e;
              if ((FVar2.m_value & 0x7fffff) == 0) {
                iVar14 = iVar8;
              }
              if ((FVar2.m_value & 0x7f800000) == 0) {
                iVar8 = iVar14;
              }
              iVar6 = iVar10 - iVar6;
              if (iVar6 < 1) {
                iVar6 = 0;
              }
              iVar10 = iVar10 - iVar8;
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              iVar6 = numAccurateBits - iVar6;
              if (iVar6 < 1) {
                iVar6 = 0;
              }
              iVar10 = numAccurateBits - iVar10;
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              fVar16 = convertFloatFlushToZeroRtn((float)local_228,local_2f8,iVar6);
              local_348._0_8_ = -INFINITY;
              iVar6 = local_278._0_4_;
              local_328._0_8_ = INFINITY;
              if (!NAN(fVar16)) {
                local_348._0_8_ = (undefined8)fVar16;
                local_328._0_8_ = local_348._0_8_;
              }
              local_2e8 = (double)CONCAT44(local_2e8._4_4_,fVar16);
              local_328._8_8_ = 0;
              local_348._8_8_ = 0;
              fVar16 = convertFloatFlushToZeroRtn(-(float)(double)local_220,iVar12,iVar10);
              dVar24 = INFINITY;
              dVar25 = -INFINITY;
              if (!NAN(fVar16)) {
                dVar24 = (double)-fVar16;
                dVar25 = dVar24;
              }
              local_208.m_hasNaN = NAN(local_2e8._0_4_) || NAN(fVar16);
              local_208.m_lo =
                   (double)(~-(ulong)((double)local_328._0_8_ <= dVar24) & (ulong)dVar24 |
                           local_328._0_8_ & -(ulong)((double)local_328._0_8_ <= dVar24));
              local_208.m_hi =
                   (double)(~-(ulong)(dVar25 <= (double)local_348._0_8_) & (ulong)dVar25 |
                           local_348._0_8_ & -(ulong)(dVar25 <= (double)local_348._0_8_));
              local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
              pp_Stack_1b0 = (_func_int **)0x4008000000000000;
              local_1a8 = 3.0;
              tcu::operator/(&local_1f0,&local_208,(Interval *)local_1b8);
              fVar16 = addErrorUlp((float)local_1f0.m_lo,-2.5,numAccurateBits);
              fVar16 = convertFloatFlushToZeroRtn(fVar16,iVar12,numAccurateBits);
              local_348._0_8_ = -INFINITY;
              local_328._0_8_ = INFINITY;
              if (!NAN(fVar16)) {
                local_348._0_8_ = (undefined8)fVar16;
                local_328._0_8_ = local_348._0_8_;
              }
              local_328._8_8_ = 0;
              local_348._8_8_ = 0;
              fVar16 = addErrorUlp((float)local_1f0.m_hi,2.5,numAccurateBits);
              fVar16 = convertFloatFlushToZeroRtn(-fVar16,iVar12,numAccurateBits);
              dVar25 = -INFINITY;
              dVar24 = INFINITY;
              if (!NAN(fVar16)) {
                dVar25 = (double)-fVar16;
                dVar24 = dVar25;
              }
              dVar23 = (double)(~-(ulong)((double)local_328._0_8_ <= dVar24) & (ulong)dVar24 |
                               local_328._0_8_ & -(ulong)((double)local_328._0_8_ <= dVar24)) -
                       (double)surfaceThreshold->m_data[uVar13];
              dVar24 = INFINITY;
              uVar21 = 0;
              if (!NAN(dVar23)) {
                dVar24 = dVar23;
                uVar21 = local_328._8_8_;
              }
              dVar26 = (double)(~-(ulong)(dVar25 <= (double)local_348._0_8_) & (ulong)dVar25 |
                               local_348._0_8_ & -(ulong)(dVar25 <= (double)local_348._0_8_)) +
                       (double)surfaceThreshold->m_data[uVar13];
              dVar25 = INFINITY;
              if (!NAN(dVar26)) {
                dVar25 = dVar26;
              }
              dVar23 = (double)(-(ulong)NAN(dVar23) & 0xfff0000000000000 |
                               ~-(ulong)NAN(dVar23) & (ulong)dVar23);
              dVar26 = (double)(-(ulong)NAN(dVar26) & 0xfff0000000000000 |
                               ~-(ulong)NAN(dVar26) & (ulong)dVar26);
              local_348._0_8_ =
                   ~-(ulong)(dVar24 <= dVar25) & (ulong)dVar25 |
                   (ulong)dVar24 & -(ulong)(dVar24 <= dVar25);
              uVar15 = -(ulong)(dVar26 <= dVar23);
              dVar25 = (double)(~uVar15 & (ulong)dVar26 | uVar15 & (ulong)dVar23);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = dVar25;
              auVar20._0_8_ = (double)local_218[uVar13];
              auVar20._8_8_ = 0;
              local_348._8_8_ = uVar21;
              if ((auVar20._0_8_ < (double)local_348._0_8_) ||
                 (uVar15 = local_2d8._0_8_, dVar25 < auVar20._0_8_)) {
                uVar15 = local_2d8._0_8_;
                local_328 = auVar27;
                local_2d8 = auVar20;
                if (iVar6 < 10) {
                  local_1b8 = (undefined1  [8])local_310;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"Error in pixel at ",0x12);
                  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,", ",2);
                  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,(int)local_350);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0," with component ",0x10);
                  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,(int)uVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0," (channel ",10);
                  local_240[0] = "plain-gather-float-2d-rgba"[uVar13 + 0x16];
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,local_240,1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,")\n",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\tGot pixel value ",0x11);
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)local_240,(int)local_338,iVar7,(int)local_350
                            );
                  tcu::operator<<((ostream *)&pp_Stack_1b0,(Vector<int,_4> *)local_240);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\t\tdFd",5);
                  local_351 = derivateFunc == DERIVATE_DFDX ^ 0x79;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,(char *)&local_351,1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0," ~= ",4);
                  std::ostream::_M_insert<double>((double)local_2d8._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\t\tdifference to a valid range: ",0x1f);
                  pcVar11 = "-";
                  if ((double)local_348._0_8_ <= (double)local_2d8._0_8_) {
                    pcVar11 = "+";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,pcVar11,1);
                  uVar15 = -(ulong)((double)local_2d8._0_8_ < local_348._0_8_);
                  std::ostream::_M_insert<double>
                            ((double)(~uVar15 & (ulong)((double)local_2d8._0_8_ -
                                                       (double)local_328._0_8_) |
                                     (ulong)(local_348._0_8_ - (double)local_2d8._0_8_) & uVar15));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\tDerivative value range:\n",0x19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\t\tMin: ",7);
                  std::ostream::_M_insert<double>((double)local_348._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\t\tMax: ",7);
                  std::ostream::_M_insert<double>((double)local_328._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pp_Stack_1b0,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
                  uVar15 = std::ios_base::~ios_base(local_140);
                }
                iVar6 = iVar6 + 1;
                uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
              }
              uVar13 = uVar13 + 1;
              derivScale = local_268;
              iVar10 = local_2fc;
            } while (local_260 != uVar13);
          }
          if ((uVar15 & 1) != 0) {
            tcu::PixelBufferAccess::setPixel(local_2c0,&local_1c8,iVar7,(int)local_350,0);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < (local_338->m_size).m_data[0]);
      }
      uVar3 = (int)local_350 + 1;
      local_350 = (ulong)uVar3;
    } while ((int)uVar3 < (local_338->m_size).m_data[1]);
  }
  if (9 < iVar6) {
    local_1b8 = (undefined1  [8])local_310;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"...",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  if (0 < iVar6) {
    local_1b8 = (undefined1  [8])local_310;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"FAIL: found ",0xc);
    std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0," failed pixels",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  return iVar6 == 0;
}

Assistant:

static bool reverifyConstantDerivateWithFlushRelaxations (tcu::TestLog&							log,
														  const tcu::ConstPixelBufferAccess&	result,
														  const tcu::PixelBufferAccess&			errorMask,
														  glu::DataType							dataType,
														  glu::Precision						precision,
														  const tcu::Vec4&						derivScale,
														  const tcu::Vec4&						derivBias,
														  const tcu::Vec4&						surfaceThreshold,
														  DerivateFunc							derivateFunc,
														  const Linear2DFunctionEvaluator&		function)
{
	DE_ASSERT(result.getWidth() == errorMask.getWidth());
	DE_ASSERT(result.getHeight() == errorMask.getHeight());
	DE_ASSERT(derivateFunc == DERIVATE_DFDX || derivateFunc == DERIVATE_DFDY);

	const tcu::IVec4	red						(255, 0, 0, 255);
	const tcu::IVec4	green					(0, 255, 0, 255);
	const float			divisionErrorUlps		= 2.5f;

	const int			numComponents			= glu::getDataTypeFloatScalars(dataType);
	const int			numBits					= getNumMantissaBits(precision);
	const int			minExponent				= getMinExponent(precision);

	const int			numVaryingSampleBits	= numBits - INTERPOLATION_LOST_BITS;
	int					numFailedPixels			= 0;

	tcu::clear(errorMask, green);

	// search for failed pixels
	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		//                 flushToZero?(f2z?(functionValueCurrent) - f2z?(functionValueBefore))
		// flushToZero? ( ------------------------------------------------------------------------ +- 2.5 ULP )
		//                                                  dx

		const tcu::Vec4	resultDerivative		= readDerivate(result, derivScale, derivBias, x, y);

		// sample at the front of the back pixel and the back of the front pixel to cover the whole area of
		// legal sample positions. In general case this is NOT OK, but we know that the target funtion is
		// (mostly*) linear which allows us to take the sample points at arbitrary points. This gets us the
		// maximum difference possible in exponents which are used in error bound calculations.
		// * non-linearity may happen around zero or with very high function values due to subnorms not
		//   behaving well.
		const tcu::Vec4	functionValueForward	= (derivateFunc == DERIVATE_DFDX)
													? (function.evaluateAt((float)x + 2.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y + 2.0f));
		const tcu::Vec4	functionValueBackward	= (derivateFunc == DERIVATE_DFDX)
													? (function.evaluateAt((float)x - 1.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y - 1.0f));

		bool	anyComponentFailed				= false;

		// check components separately
		for (int c = 0; c < numComponents; ++c)
		{
			// Simulate interpolation. Add allowed interpolation error and round to target precision. Allow one half ULP (i.e. correct rounding)
			const tcu::Interval	forwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueForward[c],  -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueForward[c],  +0.5f, numVaryingSampleBits), minExponent, numBits));
			const tcu::Interval	backwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueBackward[c], -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueBackward[c], +0.5f, numVaryingSampleBits), minExponent, numBits));
			const int			maxValueExp				= de::max(de::max(tcu::Float32(forwardComponent.lo()).exponent(),   tcu::Float32(forwardComponent.hi()).exponent()),
																  de::max(tcu::Float32(backwardComponent.lo()).exponent(),  tcu::Float32(backwardComponent.hi()).exponent()));

			// subtraction in numerator will likely cause a cancellation of the most
			// significant bits. Apply error bounds.

			const tcu::Interval	numerator				(forwardComponent - backwardComponent);
			const int			numeratorLoExp			= tcu::Float32(numerator.lo()).exponent();
			const int			numeratorHiExp			= tcu::Float32(numerator.hi()).exponent();
			const int			numeratorLoBitsLost		= de::max(0, maxValueExp - numeratorLoExp); //!< must clamp to zero since if forward and backward components have different
			const int			numeratorHiBitsLost		= de::max(0, maxValueExp - numeratorHiExp); //!< sign, numerator might have larger exponent than its operands.
			const int			numeratorLoBits			= de::max(0, numBits - numeratorLoBitsLost);
			const int			numeratorHiBits			= de::max(0, numBits - numeratorHiBitsLost);

			const tcu::Interval	numeratorRange			(convertFloatFlushToZeroRtn((float)numerator.lo(), minExponent, numeratorLoBits),
														 convertFloatFlushToZeroRtp((float)numerator.hi(), minExponent, numeratorHiBits));

			const tcu::Interval	divisionRange			= numeratorRange / 3.0f; // legal sample area is anywhere within this and neighboring pixels (i.e. size = 3)
			const tcu::Interval	divisionResultRange		(convertFloatFlushToZeroRtn(addErrorUlp((float)divisionRange.lo(), -divisionErrorUlps, numBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)divisionRange.hi(), +divisionErrorUlps, numBits), minExponent, numBits));
			const tcu::Interval	finalResultRange		(divisionResultRange.lo() - surfaceThreshold[c], divisionResultRange.hi() + surfaceThreshold[c]);

			if (resultDerivative[c] >= finalResultRange.lo() && resultDerivative[c] <= finalResultRange.hi())
			{
				// value ok
			}
			else
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES)
					log << tcu::TestLog::Message
						<< "Error in pixel at " << x << ", " << y << " with component " << c << " (channel " << ("rgba"[c]) << ")\n"
						<< "\tGot pixel value " << result.getPixelInt(x, y) << "\n"
						<< "\t\tdFd" << ((derivateFunc == DERIVATE_DFDX) ? ('x') : ('y')) << " ~= " << resultDerivative[c] << "\n"
						<< "\t\tdifference to a valid range: "
							<< ((resultDerivative[c] < finalResultRange.lo()) ? ("-") : ("+"))
							<< ((resultDerivative[c] < finalResultRange.lo()) ? (finalResultRange.lo() - resultDerivative[c]) : (resultDerivative[c] - finalResultRange.hi()))
							<< "\n"
						<< "\tDerivative value range:\n"
						<< "\t\tMin: " << finalResultRange.lo() << "\n"
						<< "\t\tMax: " << finalResultRange.hi() << "\n"
						<< tcu::TestLog::EndMessage;

				++numFailedPixels;
				anyComponentFailed = true;
			}
		}

		if (anyComponentFailed)
			errorMask.setPixel(red, x, y);
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}